

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O3

SQRESULT sq_gettypetag(HSQUIRRELVM v,SQInteger idx,SQUserPointer *typetag)

{
  SQObjectType SVar1;
  SQObjectPtr *pSVar2;
  SQObjectValue *pSVar3;
  long lVar4;
  
  if (idx < 0) {
    pSVar2 = SQVM::GetUp(v,idx);
  }
  else {
    pSVar2 = SQVM::GetAt(v,idx + v->_stackbase + -1);
  }
  SVar1 = (pSVar2->super_SQObject)._type;
  if (SVar1 == OT_CLASS) {
    pSVar3 = &(pSVar2->super_SQObject)._unVal;
  }
  else {
    if (SVar1 == OT_USERDATA) {
      pSVar3 = &(pSVar2->super_SQObject)._unVal;
      lVar4 = 0x48;
      goto LAB_0010a979;
    }
    if (SVar1 != OT_INSTANCE) {
      return -1;
    }
    pSVar3 = (SQObjectValue *)&((pSVar2->super_SQObject)._unVal.pTable)->_firstfree;
  }
  lVar4 = 0x1a0;
LAB_0010a979:
  *typetag = *(SQUserPointer *)
              ((long)&(pSVar3->pTable->super_SQDelegable).super_SQCollectable.super_SQRefCounted.
                      _vptr_SQRefCounted + lVar4);
  return 0;
}

Assistant:

SQRESULT sq_gettypetag(HSQUIRRELVM v,SQInteger idx,SQUserPointer *typetag)
{
    SQObjectPtr &o = stack_get(v,idx);
    if (SQ_FAILED(sq_getobjtypetag(&o, typetag)))
        return SQ_ERROR;// this is not an error it should be a bool but would break backward compatibility
    return SQ_OK;
}